

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

int Configtable_insert(config *data)

{
  s_x4node *__s;
  config **ppcVar1;
  int iVar2;
  uint uVar3;
  config *pcVar4;
  size_t __nmemb;
  s_x4 *psVar5;
  s_x4node *psVar6;
  s_x4node **ppsVar7;
  ulong uVar8;
  int iVar9;
  config *a;
  long lVar10;
  uint uVar11;
  config *b;
  uint uVar12;
  
  psVar5 = x4a;
  iVar9 = 0;
  if (x4a != (s_x4 *)0x0) {
    iVar9 = data->rp->index;
    uVar12 = iVar9 * 0x25 + data->dot;
    iVar2 = x4a->size;
    for (psVar6 = x4a->ht[iVar2 - 1U & uVar12]; psVar6 != (s_x4node *)0x0; psVar6 = psVar6->next) {
      if ((psVar6->data->rp->index == iVar9) && (psVar6->data->dot == data->dot)) {
        return 0;
      }
    }
    uVar3 = x4a->count;
    if (iVar2 <= (int)uVar3) {
      __nmemb = (long)iVar2 * 2;
      psVar6 = (s_x4node *)calloc(__nmemb,0x20);
      if (psVar6 == (s_x4node *)0x0) {
        return 0;
      }
      __s = psVar6 + (long)iVar2 * 2;
      iVar9 = (int)__nmemb;
      if (0 < iVar2) {
        uVar8 = 1;
        if (1 < iVar9) {
          uVar8 = __nmemb & 0xffffffff;
        }
        memset(__s,0,uVar8 << 3);
      }
      if (0 < (int)uVar3) {
        ppsVar7 = &psVar6->next;
        lVar10 = 0;
        do {
          pcVar4 = *(config **)((long)&psVar5->tbl->data + lVar10);
          uVar11 = pcVar4->rp->index * 0x25 + pcVar4->dot & iVar9 - 1U;
          if ((&__s->data)[uVar11] != (config *)0x0) {
            (&__s->data)[uVar11]->fws = (char *)ppsVar7;
          }
          ppcVar1 = &__s->data + uVar11;
          *ppsVar7 = (s_x4node *)*ppcVar1;
          ((s_x4node *)(ppsVar7 + -1))->data = pcVar4;
          ppsVar7[1] = (s_x4node *)ppcVar1;
          *ppcVar1 = (config *)(ppsVar7 + -1);
          ppsVar7 = ppsVar7 + 3;
          lVar10 = lVar10 + 0x18;
        } while ((ulong)uVar3 * 0x18 != lVar10);
      }
      free(psVar5->tbl);
      psVar5->size = iVar9;
      psVar5->count = uVar3;
      psVar5->tbl = psVar6;
      psVar5->ht = (s_x4node **)__s;
    }
    uVar12 = psVar5->size - 1U & uVar12;
    iVar9 = psVar5->count;
    psVar5->count = iVar9 + 1;
    psVar6 = psVar5->tbl + iVar9;
    psVar6->data = data;
    ppsVar7 = psVar5->ht;
    if (ppsVar7[uVar12] != (s_x4node *)0x0) {
      ppsVar7[uVar12]->from = &psVar6->next;
    }
    psVar6->next = ppsVar7[uVar12];
    ppsVar7[uVar12] = psVar6;
    psVar6->from = psVar5->ht + uVar12;
    iVar9 = 1;
  }
  return iVar9;
}

Assistant:

int Configtable_insert(struct config *data)
{
  x4node *np;
  unsigned h;
  unsigned ph;

  if( x4a==0 ) return 0;
  ph = confighash(data);
  h = ph & (x4a->size-1);
  np = x4a->ht[h];
  while( np ){
    if( Configcmp((const char *) np->data,(const char *) data)==0 ){
      /* An existing entry with the same key is found. */
      /* Fail because overwrite is not allows. */
      return 0;
    }
    np = np->next;
  }
  if( x4a->count>=x4a->size ){
    /* Need to make the hash table bigger */
    int i,size;
    struct s_x4 array;
    array.size = size = x4a->size*2;
    array.count = x4a->count;
    array.tbl = (x4node*)calloc(size, sizeof(x4node) + sizeof(x4node*));
    if( array.tbl==0 ) return 0;  /* Fail due to malloc failure */
    array.ht = (x4node**)&(array.tbl[size]);
    for(i=0; i<size; i++) array.ht[i] = 0;
    for(i=0; i<x4a->count; i++){
      x4node *oldnp, *newnp;
      oldnp = &(x4a->tbl[i]);
      h = confighash(oldnp->data) & (size-1);
      newnp = &(array.tbl[i]);
      if( array.ht[h] ) array.ht[h]->from = &(newnp->next);
      newnp->next = array.ht[h];
      newnp->data = oldnp->data;
      newnp->from = &(array.ht[h]);
      array.ht[h] = newnp;
    }
    free(x4a->tbl);
    *x4a = array;
  }
  /* Insert the new data */
  h = ph & (x4a->size-1);
  np = &(x4a->tbl[x4a->count++]);
  np->data = data;
  if( x4a->ht[h] ) x4a->ht[h]->from = &(np->next);
  np->next = x4a->ht[h];
  x4a->ht[h] = np;
  np->from = &(x4a->ht[h]);
  return 1;
}